

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
gms_matcher::GetNB9(vector<int,_std::allocator<int>_> *__return_storage_ptr__,gms_matcher *this,
                   int idx,Size *GridSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  int iVar6;
  int idx_yy;
  int idx_xx;
  int xi;
  int yi;
  int idx_y;
  int idx_x;
  allocator<int> local_31;
  value_type_conflict1 local_30;
  undefined1 local_29;
  Size *local_28;
  Size *GridSize_local;
  gms_matcher *pgStack_18;
  int idx_local;
  gms_matcher *this_local;
  vector<int,_std::allocator<int>_> *NB9;
  
  local_29 = 0;
  local_30 = -1;
  local_28 = GridSize;
  GridSize_local._4_4_ = idx;
  pgStack_18 = this;
  this_local = (gms_matcher *)__return_storage_ptr__;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,9,&local_30,&local_31);
  std::allocator<int>::~allocator(&local_31);
  iVar6 = GridSize_local._4_4_ % local_28->width;
  iVar2 = GridSize_local._4_4_ / local_28->width;
  for (idx_xx = -1; idx_xx < 2; idx_xx = idx_xx + 1) {
    for (idx_yy = -1; idx_yy < 2; idx_yy = idx_yy + 1) {
      iVar3 = iVar6 + idx_yy;
      iVar4 = iVar2 + idx_xx;
      if ((((-1 < iVar3) && (iVar3 < local_28->width)) && (-1 < iVar4)) &&
         (iVar4 < local_28->height)) {
        iVar1 = local_28->width;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (__return_storage_ptr__,(long)(idx_yy + 4 + idx_xx * 3));
        *pvVar5 = iVar3 + iVar4 * iVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> GetNB9(const int idx, const Size& GridSize) {
		vector<int> NB9(9, -1);

		int idx_x = idx % GridSize.width;
		int idx_y = idx / GridSize.width;

		for (int yi = -1; yi <= 1; yi++)
		{
			for (int xi = -1; xi <= 1; xi++)
			{	
				int idx_xx = idx_x + xi;
				int idx_yy = idx_y + yi;

				if (idx_xx < 0 || idx_xx >= GridSize.width || idx_yy < 0 || idx_yy >= GridSize.height)
					continue;

				NB9[xi + 4 + yi * 3] = idx_xx + idx_yy * GridSize.width;
			}
		}
		return NB9;
	}